

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_Test::TEST_PluginTest_DisablesPluginsDontRun_Test
          (TEST_PluginTest_DisablesPluginsDontRun_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture = (TestTestingFixture *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).secondPlugin =
       (DummyPluginWhichAcceptsParameters *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin = (DummyPlugin *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin = (DummyPlugin *)0x0;
  TEST_GROUP_CppUTestGroupPluginTest::TEST_GROUP_CppUTestGroupPluginTest
            (&this->super_TEST_GROUP_CppUTestGroupPluginTest);
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_003536d8;
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}